

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen;
  Token semi1;
  Token semi2_00;
  Info *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  SyntaxNode *pSVar6;
  ExpressionSyntax *stopExpr;
  ExpressionSyntax *pEVar7;
  StatementSyntax *statement;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar8;
  SourceLocation SVar9;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  bool bVar10;
  Token TVar11;
  SourceRange range;
  Token TVar12;
  string_view syntaxName;
  Token forKeyword;
  Token local_248;
  Token local_238;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_228;
  uint local_218;
  SourceLocation local_210;
  pointer local_208;
  SourceLocation local_200;
  Info *local_1f8;
  undefined8 local_1f0;
  NamedLabelSyntax *local_1e8;
  Info *local_1e0;
  undefined8 local_1d8;
  pointer local_1d0;
  SourceLocation local_1c8;
  Token semi2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_128;
  Token local_f8;
  Token local_e8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_60;
  
  SVar9 = (SourceLocation)attributes.size_;
  local_1d0 = attributes.data_;
  local_1e8 = label;
  local_1c8 = SVar9;
  TVar11 = ParserBase::consume(&this->super_ParserBase);
  local_1f8 = TVar11.info;
  local_1f0 = TVar11._0_8_;
  TVar11 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_1e0 = TVar11.info;
  local_1d8 = TVar11._0_8_;
  Token::Token(&local_248);
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  bVar4 = isVariableDeclaration(this);
  if (bVar4) {
    TVar11 = ParserBase::peek(&this->super_ParserBase);
    bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11.kind);
    if (bVar4) {
      local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar4 = slang::syntax::SyntaxFacts::isPossibleForInitializer(TVar11.kind);
      if (bVar4) {
        do {
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          pSVar6 = parseForInitializer(this);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar6;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               CONCAT71(steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
          if ((bVar4) || (bVar4 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar4)) break;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::expect(&this->super_ParserBase,Comma);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
          if (bVar4) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = TVar11.kind == TVar12.kind;
          bVar10 = TVar11.info == TVar12.info;
          SVar9._0_1_ = bVar10 && bVar4;
        } while ((!bVar10 || !bVar4) ||
                (bVar4 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x2c0005,true), bVar4));
        local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        SVar9 = (SourceLocation)0x15;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar11,Semicolon,&local_248,(DiagCode)0x2c0005);
      }
    }
  }
  else {
    TVar11 = ParserBase::peek(&this->super_ParserBase);
    bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11.kind);
    if (bVar4) {
      local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar4 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar11.kind);
      if (bVar4) {
        do {
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          pSVar6 = &parseExpression(this)->super_SyntaxNode;
          if (pSVar6->kind != AssignmentExpression) {
            if (pSVar6->kind == IdentifierName) {
              TVar12 = slang::syntax::SyntaxNode::getFirstToken(pSVar6);
              if ((TVar12._0_4_ >> 0x10 & 1) != 0) goto LAB_002c625a;
            }
            range = slang::syntax::SyntaxNode::sourceRange(pSVar6);
            SVar9 = range.endLoc;
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,range);
          }
LAB_002c625a:
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar6;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               CONCAT71(steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
          if ((bVar4) || (bVar4 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar4)) break;
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::expect(&this->super_ParserBase,Comma);
          steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&steps);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
          if (bVar4) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          bVar4 = TVar11.kind == TVar12.kind;
          bVar10 = TVar11.info == TVar12.info;
          SVar9._0_1_ = bVar10 && bVar4;
        } while ((!bVar10 || !bVar4) ||
                (bVar4 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x2c0005,true), bVar4));
        local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        SVar9 = (SourceLocation)0x15;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar11,Semicolon,&local_248,(DiagCode)0x2c0005);
      }
    }
  }
  Token::Token(&semi2);
  bVar4 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar4) {
    semi2 = ParserBase::consume(&this->super_ParserBase);
    stopExpr = (ExpressionSyntax *)0x0;
  }
  else {
    stopExpr = parseExpression(this);
    semi2 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  Token::Token(&local_238);
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar11 = ParserBase::peek(&this->super_ParserBase);
  bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11.kind);
  if (bVar4) {
    local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar4 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar11.kind);
    if (bVar4) {
      do {
        TVar11 = ParserBase::peek(&this->super_ParserBase);
        pEVar7 = parseExpression(this);
        local_228._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar7;
        local_218 = CONCAT31(local_218._1_3_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_228._M_first);
        TVar12 = ParserBase::peek(&this->super_ParserBase);
        bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
        if (bVar4) break;
        bVar4 = ParserBase::peek(&this->super_ParserBase,Comma);
        if (!bVar4) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar4 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,false);
            if (!bVar4) {
              local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_002c659c;
            }
            bVar4 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar4);
        }
        local_228._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_218 = local_218 & 0xffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_228._M_first);
        TVar12 = ParserBase::peek(&this->super_ParserBase);
        bVar4 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
        if (bVar4) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar12 = ParserBase::peek(&this->super_ParserBase);
        bVar4 = TVar11.kind == TVar12.kind;
        bVar10 = TVar11.info == TVar12.info;
        SVar9._0_1_ = bVar10 && bVar4;
      } while ((!bVar10 || !bVar4) ||
              (bVar4 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                 (&this->super_ParserBase,(DiagCode)0x10001,true), bVar4));
      local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      SVar9 = (SourceLocation)0x13;
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar11,CloseParenthesis,&local_238,(DiagCode)0x10001);
    }
  }
LAB_002c659c:
  statement = parseStatement(this,true,false);
  TVar11 = local_238;
  TVar12.info = (Info *)SVar9;
  TVar12.kind = local_238.kind;
  TVar12._2_1_ = local_238._2_1_;
  TVar12.numFlags.raw = local_238.numFlags.raw;
  TVar12.rawLen = local_238.rawLen;
  syntaxName._M_str = "for loop";
  syntaxName._M_len = 8;
  local_238 = TVar11;
  checkEmptyBody(this,&statement->super_SyntaxNode,TVar12,syntaxName);
  uVar2 = local_1d8;
  pIVar1 = local_1e0;
  local_218 = 1;
  local_210 = local_1c8;
  local_208 = local_1d0;
  local_200 = local_1c8;
  local_228 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4703a8);
  iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  TVar12 = semi2;
  TVar11 = local_248;
  local_128.elements.data_ = (pointer)CONCAT44(extraout_var,iVar5);
  local_128.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_128.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_128.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473550;
  local_e8.kind = local_248.kind;
  local_e8._2_1_ = local_248._2_1_;
  local_e8.numFlags.raw = local_248.numFlags.raw;
  local_e8.rawLen = local_248.rawLen;
  local_e8.info = local_248.info;
  local_f8.kind = semi2.kind;
  local_f8._2_1_ = semi2._2_1_;
  local_f8.numFlags.raw = semi2.numFlags.raw;
  local_f8.rawLen = semi2.rawLen;
  local_f8.info = semi2.info;
  local_248 = TVar11;
  semi2 = TVar12;
  iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  uVar3 = local_1d8;
  local_60.elements.data_ = (pointer)CONCAT44(extraout_var_00,iVar5);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004730a0;
  openParen.info = pIVar1;
  local_1d8._0_2_ = (undefined2)uVar2;
  local_1d8._2_1_ = SUB81(uVar2,2);
  local_1d8._3_1_ = SUB81(uVar2,3);
  local_1d8._4_4_ = SUB84(uVar2,4);
  openParen.kind = (undefined2)local_1d8;
  openParen._2_1_ = local_1d8._2_1_;
  openParen.numFlags.raw = local_1d8._3_1_;
  openParen.rawLen = local_1d8._4_4_;
  semi1.info = local_e8.info;
  semi1.kind = local_e8.kind;
  semi1._2_1_ = local_e8._2_1_;
  semi1.numFlags.raw = local_e8.numFlags.raw;
  semi1.rawLen = local_e8.rawLen;
  semi2_00.info = local_f8.info;
  semi2_00.kind = local_f8.kind;
  semi2_00._2_1_ = local_f8._2_1_;
  semi2_00.numFlags.raw = local_f8.numFlags.raw;
  semi2_00.rawLen = local_f8.rawLen;
  forKeyword.info = local_1f8;
  forKeyword.kind = (undefined2)local_1f0;
  forKeyword._2_1_ = local_1f0._2_1_;
  forKeyword.numFlags.raw = local_1f0._3_1_;
  forKeyword.rawLen = local_1f0._4_4_;
  local_1d8 = uVar3;
  pFVar8 = slang::syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,local_1e8,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_228._M_first,
                      forKeyword,openParen,&local_128,semi1,stopExpr,semi2_00,&local_60,local_238,
                      statement);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&steps.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&initializers.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  return pFVar8;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}